

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ShapeRange * __thiscall
CoreML::ShapeRange::unify(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  bool bVar1;
  ShapeRange *val;
  RangeValue *this_00;
  RangeValue local_28;
  
  ShapeRange(__return_storage_ptr__);
  local_28._isUnbound = (other->_minimum)._isUnbound;
  local_28._val = (other->_minimum)._val;
  bVar1 = RangeValue::operator<=(&this->_minimum,&local_28);
  val = this;
  if (!bVar1) {
    local_28._isUnbound = (other->_minimum)._isUnbound;
    local_28._val = (other->_minimum)._val;
    val = (ShapeRange *)&local_28;
  }
  setLower(__return_storage_ptr__,&val->_minimum);
  this_00 = &this->_maximum;
  local_28._isUnbound = (other->_maximum)._isUnbound;
  local_28._val = (other->_maximum)._val;
  bVar1 = RangeValue::operator>=(this_00,&local_28);
  if (!bVar1) {
    local_28._isUnbound = (other->_maximum)._isUnbound;
    local_28._val = (other->_maximum)._val;
    this_00 = &local_28;
  }
  setUpper(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::unify(const ShapeRange& other) const {
    ShapeRange out;

    if (_minimum <= other.minimum())
        out.setLower(_minimum);
    else
        out.setLower(other.minimum());

    if (_maximum >= other.maximum())
        out.setUpper(_maximum);
    else
        out.setUpper(other.maximum());

    return out;
}